

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

boolean adjattrib(int ndx,int incr,boolean force,int msgflg)

{
  char cVar1;
  schar sVar2;
  char *pcVar3;
  char *local_48;
  int msgflg_local;
  boolean force_local;
  int incr_local;
  int ndx_local;
  
  if (((u.uprops[0x3b].extrinsic == 0) || (force != '\0')) && (incr != 0)) {
    if (((ndx == 1) || (ndx == 2)) &&
       ((force == '\0' && ((uarmh != (obj *)0x0 && (uarmh->otyp == 0x4d)))))) {
      if (msgflg == 0) {
        pline("Your cap constricts briefly, then relaxes again.");
      }
      incr_local._3_1_ = '\0';
    }
    else {
      msgflg_local = incr;
      if (incr < 1) {
        if (u.acurr.a[ndx] <= urace.attrmin[ndx]) {
          if ((msgflg == 0) && (flags.verbose != '\0')) {
            pline("You\'re already as %s as you can get.",minusattr[ndx]);
          }
          u.acurr.a[ndx] = urace.attrmin[ndx];
          return '\0';
        }
        u.acurr.a[ndx] = u.acurr.a[ndx] + (char)incr;
        if (u.acurr.a[ndx] < urace.attrmin[ndx]) {
          msgflg_local = (int)u.acurr.a[ndx] - (int)urace.attrmin[ndx];
          u.acurr.a[ndx] = urace.attrmin[ndx];
          u.amax.a[ndx] = u.amax.a[ndx] + (char)msgflg_local;
          if (u.amax.a[ndx] < urace.attrmin[ndx]) {
            u.amax.a[ndx] = urace.attrmin[ndx];
          }
        }
      }
      else {
        if (((ndx == 0) && (u.umonnum != u.umonster)) &&
           (((youmonst.data)->mflags2 & 0x4000000) != 0)) {
          cVar1 = 'v';
        }
        else {
          cVar1 = urace.attrmax[ndx];
        }
        if ((cVar1 <= u.amax.a[ndx]) && (sVar2 = acurr(ndx), u.amax.a[ndx] <= sVar2)) {
          if ((msgflg == 0) && (flags.verbose != '\0')) {
            pline("You\'re already as %s as you can get.",plusattr[ndx]);
          }
          if (((ndx == 0) && (u.umonnum != u.umonster)) &&
             (((youmonst.data)->mflags2 & 0x4000000) != 0)) {
            sVar2 = 'v';
          }
          else {
            sVar2 = urace.attrmax[ndx];
          }
          u.amax.a[ndx] = sVar2;
          u.acurr.a[ndx] = sVar2;
          return '\0';
        }
        u.acurr.a[ndx] = u.acurr.a[ndx] + (char)incr;
        if (u.amax.a[ndx] < u.acurr.a[ndx]) {
          msgflg_local = (int)u.acurr.a[ndx] - (int)u.amax.a[ndx];
          u.amax.a[ndx] = u.amax.a[ndx] + (char)msgflg_local;
          if (((ndx == 0) && (u.umonnum != u.umonster)) &&
             (((youmonst.data)->mflags2 & 0x4000000) != 0)) {
            cVar1 = 'v';
          }
          else {
            cVar1 = urace.attrmax[ndx];
          }
          if (cVar1 < u.amax.a[ndx]) {
            if (((ndx == 0) && (u.umonnum != u.umonster)) &&
               (((youmonst.data)->mflags2 & 0x4000000) != 0)) {
              sVar2 = 'v';
            }
            else {
              sVar2 = urace.attrmax[ndx];
            }
            u.amax.a[ndx] = sVar2;
          }
          u.acurr.a[ndx] = u.amax.a[ndx];
        }
      }
      if (msgflg < 1) {
        pcVar3 = "";
        if (1 < msgflg_local || msgflg_local < -1) {
          pcVar3 = "very ";
        }
        if (msgflg_local < 1) {
          local_48 = minusattr[ndx];
        }
        else {
          local_48 = plusattr[ndx];
        }
        pline("You feel %s%s!",pcVar3,local_48);
      }
      iflags.botl = '\x01';
      if ((1 < moves) && ((ndx == 0 || (ndx == 4)))) {
        encumber_msg();
      }
      incr_local._3_1_ = '\x01';
    }
  }
  else {
    incr_local._3_1_ = '\0';
  }
  return incr_local._3_1_;
}

Assistant:

boolean adjattrib(
	int ndx,
	int incr,
	boolean force,
	int msgflg	    /* positive => no message, zero => message, and */
	                    /* negative => conditional (msg if change made) */
	)
{			    
	if ((Fixed_abil && !force) || !incr) return FALSE;

	if ((ndx == A_INT || ndx == A_WIS) &&
	    !force && uarmh && uarmh->otyp == DUNCE_CAP) {
		if (msgflg == 0)
		    pline("Your cap constricts briefly, then relaxes again.");
		return FALSE;
	}

	if (incr > 0) {
	    if ((AMAX(ndx) >= ATTRMAX(ndx)) && (ACURR(ndx) >= AMAX(ndx))) {
		if (msgflg == 0 && flags.verbose)
		    pline("You're already as %s as you can get.",
			  plusattr[ndx]);
		ABASE(ndx) = AMAX(ndx) = ATTRMAX(ndx); /* just in case */
		return FALSE;
	    }

	    ABASE(ndx) += incr;
	    if (ABASE(ndx) > AMAX(ndx)) {
		incr = ABASE(ndx) - AMAX(ndx);
		AMAX(ndx) += incr;
		if (AMAX(ndx) > ATTRMAX(ndx))
		    AMAX(ndx) = ATTRMAX(ndx);
		ABASE(ndx) = AMAX(ndx);
	    }
	} else {
	    if (ABASE(ndx) <= ATTRMIN(ndx)) {
		if (msgflg == 0 && flags.verbose)
		    pline("You're already as %s as you can get.",
			  minusattr[ndx]);
		ABASE(ndx) = ATTRMIN(ndx); /* just in case */
		return FALSE;
	    }

	    ABASE(ndx) += incr;
	    if (ABASE(ndx) < ATTRMIN(ndx)) {
		incr = ABASE(ndx) - ATTRMIN(ndx);
		ABASE(ndx) = ATTRMIN(ndx);
		AMAX(ndx) += incr;
		if (AMAX(ndx) < ATTRMIN(ndx))
		    AMAX(ndx) = ATTRMIN(ndx);
	    }
	}
	if (msgflg <= 0)
	    pline("You feel %s%s!",
		  (incr > 1 || incr < -1) ? "very ": "",
		  (incr > 0) ? plusattr[ndx] : minusattr[ndx]);
	iflags.botl = 1;
	if (moves > 1 && (ndx == A_STR || ndx == A_CON))
		encumber_msg();
	return TRUE;
}